

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O1

bool __thiscall asl::Socket_::waitInput(Socket_ *this,double t)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  bool bVar6;
  double dVar7;
  timeval to;
  fd_set rset;
  timeval local_b8;
  fd_set local_a8;
  
  if (-1 < *(int *)&(this->super_SmartObject_).field_0xc) {
    iVar2 = (*(this->super_SmartObject_)._vptr_SmartObject_[0xc])();
    bVar6 = true;
    if (iVar2 < 1) {
      if (iVar2 < 0) {
        this->_error = 6;
      }
      else {
        dVar7 = floor(t);
        local_b8.tv_sec = (__time_t)(int)dVar7;
        local_b8.tv_usec = (__suseconds_t)(int)((t - dVar7) * 1000000.0);
        local_a8.fds_bits[0] = 0;
        local_a8.fds_bits[1] = 0;
        local_a8.fds_bits[2] = 0;
        local_a8.fds_bits[3] = 0;
        local_a8.fds_bits[4] = 0;
        local_a8.fds_bits[5] = 0;
        local_a8.fds_bits[6] = 0;
        local_a8.fds_bits[7] = 0;
        local_a8.fds_bits[8] = 0;
        local_a8.fds_bits[9] = 0;
        local_a8.fds_bits[10] = 0;
        local_a8.fds_bits[0xb] = 0;
        local_a8.fds_bits[0xc] = 0;
        local_a8.fds_bits[0xd] = 0;
        local_a8.fds_bits[0xe] = 0;
        local_a8.fds_bits[0xf] = 0;
        iVar3 = (*(this->super_SmartObject_)._vptr_SmartObject_[4])(this);
        iVar4 = (*(this->super_SmartObject_)._vptr_SmartObject_[4])(this);
        iVar2 = iVar4 + 0x3f;
        if (-1 < iVar4) {
          iVar2 = iVar4;
        }
        local_a8.fds_bits[iVar2 >> 6] = local_a8.fds_bits[iVar2 >> 6] | 1L << ((byte)iVar3 & 0x3f);
        iVar2 = (*(this->super_SmartObject_)._vptr_SmartObject_[4])(this);
        iVar2 = select(iVar2 + 1,&local_a8,(fd_set *)0x0,(fd_set *)0x0,&local_b8);
        if (iVar2 < 0) {
          this->_error = 7;
          bVar6 = true;
        }
        else {
          iVar3 = (*(this->super_SmartObject_)._vptr_SmartObject_[4])(this);
          iVar2 = iVar3 + 0x3f;
          if (-1 < iVar3) {
            iVar2 = iVar3;
          }
          uVar1 = local_a8.fds_bits[iVar2 >> 6];
          uVar5 = (*(this->super_SmartObject_)._vptr_SmartObject_[4])(this);
          bVar6 = (uVar1 >> ((ulong)uVar5 & 0x3f) & 1) != 0;
        }
      }
    }
    return bVar6;
  }
  return false;
}

Assistant:

bool Socket_::waitInput(double t)
{
	if (_handle < 0)
		return false;
	int a = available();
	if (a > 0)
		return true;
	if (a < 0)
	{
		_error = SOCKET_BAD_DATA;
		return true;
	}
	fd_set rset;
	timeval to;
	to.tv_sec = (int)floor(t);
	to.tv_usec = (int)((t-floor(t))*1e6);
	FD_ZERO(&rset);
	FD_SET(handle(), &rset);
	if(select(handle()+1, &rset, 0, 0, &to) >= 0)
		return FD_ISSET(handle(), &rset)!=0;
	_error = SOCKET_BAD_WAIT;
	return true;
}